

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3sDrawTests.cpp
# Opt level: O0

int __thiscall deqp::gles3::Stress::DrawTests::init(DrawTests *this,EVP_PKEY_CTX *ctx)

{
  Context *context;
  int extraout_EAX;
  TestNode *node;
  TestNode *node_00;
  MethodGroup *this_00;
  char *name_00;
  char *descr;
  TestNode *node_01;
  DrawInvalidRangeCase *pDVar1;
  DrawMethod method;
  undefined8 extraout_RDX;
  undefined8 uVar2;
  undefined8 extraout_RDX_00;
  undefined1 local_80 [8];
  string desc;
  string name;
  int ndx;
  DrawMethod basicMethods [3];
  TestCaseGroup *drawRangeGroup;
  TestCaseGroup *unalignedGroup;
  DrawTests *this_local;
  
  node = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)node,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "unaligned_data","Test with unaligned data");
  node_00 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)node_00,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "draw_range_elements","Test drawRangeElements");
  tcu::TestNode::addChild((TestNode *)this,node);
  tcu::TestNode::addChild((TestNode *)this,node_00);
  stack0xffffffffffffffc4 = 0x500000003;
  uVar2 = extraout_RDX;
  for (name.field_2._8_4_ = 0; (int)name.field_2._8_4_ < 3;
      name.field_2._8_4_ = name.field_2._8_4_ + 1) {
    deqp::gls::DrawTestSpec::drawMethodToString_abi_cxx11_
              ((string *)((long)&desc.field_2 + 8),
               (DrawTestSpec *)
               (ulong)*(uint *)((long)&name.field_2 + (long)(int)name.field_2._8_4_ * 4 + 0xc),
               (DrawMethod)uVar2);
    deqp::gls::DrawTestSpec::drawMethodToString_abi_cxx11_
              ((string *)local_80,
               (DrawTestSpec *)
               (ulong)*(uint *)((long)&name.field_2 + (long)(int)name.field_2._8_4_ * 4 + 0xc),
               method);
    this_00 = (MethodGroup *)operator_new(0x80);
    context = (this->super_TestCaseGroup).m_context;
    name_00 = (char *)std::__cxx11::string::c_str();
    descr = (char *)std::__cxx11::string::c_str();
    Stress::anon_unknown_0::MethodGroup::MethodGroup
              (this_00,context,name_00,descr,
               *(DrawMethod *)((long)&name.field_2 + (long)(int)name.field_2._8_4_ * 4 + 0xc));
    tcu::TestNode::addChild(node,(TestNode *)this_00);
    std::__cxx11::string::~string((string *)local_80);
    std::__cxx11::string::~string((string *)(desc.field_2._M_local_buf + 8));
    uVar2 = extraout_RDX_00;
  }
  node_01 = (TestNode *)operator_new(0x78);
  Stress::anon_unknown_0::RandomGroup::RandomGroup
            ((RandomGroup *)node_01,(this->super_TestCaseGroup).m_context,"random",
             "random draw commands.");
  tcu::TestNode::addChild(node,node_01);
  pDVar1 = (DrawInvalidRangeCase *)operator_new(0xa0);
  Stress::anon_unknown_0::DrawInvalidRangeCase::DrawInvalidRangeCase
            (pDVar1,(this->super_TestCaseGroup).m_context,"range_max_over_bounds",
             "Range over buffer bounds",0,0x210000,false,false);
  tcu::TestNode::addChild(node_00,(TestNode *)pDVar1);
  pDVar1 = (DrawInvalidRangeCase *)operator_new(0xa0);
  Stress::anon_unknown_0::DrawInvalidRangeCase::DrawInvalidRangeCase
            (pDVar1,(this->super_TestCaseGroup).m_context,"range_max_over_bounds_near_signed_wrap",
             "Range over buffer bounds",0,0x7fffffff,false,false);
  tcu::TestNode::addChild(node_00,(TestNode *)pDVar1);
  pDVar1 = (DrawInvalidRangeCase *)operator_new(0xa0);
  Stress::anon_unknown_0::DrawInvalidRangeCase::DrawInvalidRangeCase
            (pDVar1,(this->super_TestCaseGroup).m_context,"range_max_over_bounds_near_unsigned_wrap"
             ,"Range over buffer bounds",0,0xffffffff,false,false);
  tcu::TestNode::addChild(node_00,(TestNode *)pDVar1);
  pDVar1 = (DrawInvalidRangeCase *)operator_new(0xa0);
  Stress::anon_unknown_0::DrawInvalidRangeCase::DrawInvalidRangeCase
            (pDVar1,(this->super_TestCaseGroup).m_context,"range_max_over_bounds_near_max",
             "Range over buffer bounds",0,0,false,true);
  tcu::TestNode::addChild(node_00,(TestNode *)pDVar1);
  pDVar1 = (DrawInvalidRangeCase *)operator_new(0xa0);
  Stress::anon_unknown_0::DrawInvalidRangeCase::DrawInvalidRangeCase
            (pDVar1,(this->super_TestCaseGroup).m_context,"range_min_max_over_bounds",
             "Range over buffer bounds",0x200000,0x210000,false,false);
  tcu::TestNode::addChild(node_00,(TestNode *)pDVar1);
  pDVar1 = (DrawInvalidRangeCase *)operator_new(0xa0);
  Stress::anon_unknown_0::DrawInvalidRangeCase::DrawInvalidRangeCase
            (pDVar1,(this->super_TestCaseGroup).m_context,
             "range_min_max_over_bounds_near_signed_wrap","Range over buffer bounds",0x7ffffff0,
             0x7fffffff,false,false);
  tcu::TestNode::addChild(node_00,(TestNode *)pDVar1);
  pDVar1 = (DrawInvalidRangeCase *)operator_new(0xa0);
  Stress::anon_unknown_0::DrawInvalidRangeCase::DrawInvalidRangeCase
            (pDVar1,(this->super_TestCaseGroup).m_context,
             "range_min_max_over_bounds_near_unsigned_wrap","Range over buffer bounds",0xfffffff0,
             0xffffffff,false,false);
  tcu::TestNode::addChild(node_00,(TestNode *)pDVar1);
  pDVar1 = (DrawInvalidRangeCase *)operator_new(0xa0);
  Stress::anon_unknown_0::DrawInvalidRangeCase::DrawInvalidRangeCase
            (pDVar1,(this->super_TestCaseGroup).m_context,"range_min_max_over_bounds_near_max",
             "Range over buffer bounds",0,0,true,true);
  tcu::TestNode::addChild(node_00,(TestNode *)pDVar1);
  return extraout_EAX;
}

Assistant:

void DrawTests::init (void)
{
	tcu::TestCaseGroup* const unalignedGroup	= new tcu::TestCaseGroup(m_testCtx, "unaligned_data", "Test with unaligned data");
	tcu::TestCaseGroup* const drawRangeGroup	= new tcu::TestCaseGroup(m_testCtx, "draw_range_elements", "Test drawRangeElements");

	addChild(unalignedGroup);
	addChild(drawRangeGroup);

	// .unaligned_data
	{
		const gls::DrawTestSpec::DrawMethod basicMethods[] =
		{
			// gls::DrawTestSpec::DRAWMETHOD_DRAWARRAYS,
			gls::DrawTestSpec::DRAWMETHOD_DRAWELEMENTS,
			// gls::DrawTestSpec::DRAWMETHOD_DRAWARRAYS_INSTANCED,
			gls::DrawTestSpec::DRAWMETHOD_DRAWELEMENTS_INSTANCED,
			gls::DrawTestSpec::DRAWMETHOD_DRAWELEMENTS_RANGED,
		};

		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(basicMethods); ++ndx)
		{
			const std::string name = gls::DrawTestSpec::drawMethodToString(basicMethods[ndx]);
			const std::string desc = gls::DrawTestSpec::drawMethodToString(basicMethods[ndx]);

			unalignedGroup->addChild(new MethodGroup(m_context, name.c_str(), desc.c_str(), basicMethods[ndx]));
		}

		// Random

		unalignedGroup->addChild(new RandomGroup(m_context, "random", "random draw commands."));
	}

	// .draw_range_elements
	{
		// use a larger range than the buffer size is
		drawRangeGroup->addChild(new DrawInvalidRangeCase(m_context, "range_max_over_bounds",							"Range over buffer bounds",	0x00000000,	0x00210000));
		drawRangeGroup->addChild(new DrawInvalidRangeCase(m_context, "range_max_over_bounds_near_signed_wrap",			"Range over buffer bounds",	0x00000000,	0x7FFFFFFF));
		drawRangeGroup->addChild(new DrawInvalidRangeCase(m_context, "range_max_over_bounds_near_unsigned_wrap",		"Range over buffer bounds",	0x00000000,	0xFFFFFFFF));
		drawRangeGroup->addChild(new DrawInvalidRangeCase(m_context, "range_max_over_bounds_near_max",					"Range over buffer bounds",	0x00000000, 0x00000000, false, true));

		drawRangeGroup->addChild(new DrawInvalidRangeCase(m_context, "range_min_max_over_bounds",						"Range over buffer bounds",	0x00200000,	0x00210000));
		drawRangeGroup->addChild(new DrawInvalidRangeCase(m_context, "range_min_max_over_bounds_near_signed_wrap",		"Range over buffer bounds",	0x7FFFFFF0,	0x7FFFFFFF));
		drawRangeGroup->addChild(new DrawInvalidRangeCase(m_context, "range_min_max_over_bounds_near_unsigned_wrap",	"Range over buffer bounds",	0xFFFFFFF0,	0xFFFFFFFF));
		drawRangeGroup->addChild(new DrawInvalidRangeCase(m_context, "range_min_max_over_bounds_near_max",				"Range over buffer bounds",	0x00000000, 0x00000000, true, true));
	}
}